

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::SpecConstantTest::initPrograms
          (SpecConstantTest *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkShaderStageFlagBits VVar2;
  pointer pcVar3;
  VkShaderStageFlagBits VVar4;
  VkShaderStageFlagBits VVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  ProgramSources *pPVar9;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_00;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_01;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_02;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_03;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ostringstream src;
  undefined1 auStack_248 [8];
  long *local_240;
  long local_238;
  long local_230 [2];
  string local_220;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  VkShaderStageFlagBits local_1b4;
  SourceCollections *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  VVar2 = this->m_stage;
  VVar5 = VVar2 | (VK_SHADER_STAGE_FRAGMENT_BIT|VK_SHADER_STAGE_VERTEX_BIT);
  if ((VVar2 & VK_SHADER_STAGE_ALL_GRAPHICS) == 0) {
    VVar5 = VVar2;
  }
  VVar4 = VVar5 | (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                  VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  if ((VVar5 & (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT
               )) == 0) {
    VVar4 = VVar5;
  }
  local_1b4 = VVar4;
  local_1b0 = programCollection;
  if ((VVar4 & VK_SHADER_STAGE_VERTEX_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in highp vec4 position;\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (VVar2 == VK_SHADER_STAGE_VERTEX_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants);
    }
    else {
      local_200._0_8_ = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    if (VVar2 == VK_SHADER_STAGE_VERTEX_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if (VVar2 == VK_SHADER_STAGE_VERTEX_BIT) {
      local_240 = local_230;
      pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_240);
    }
    else {
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    local_1d8 = local_1c8;
    if (VVar2 == VK_SHADER_STAGE_VERTEX_BIT) {
      pcVar3 = (this->m_caseDef).mainCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (this->m_caseDef).mainCode._M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    gl_Position = position;\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"vert","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_8_ = local_200._0_8_ & 0xffffffff00000000;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    VVar4 = local_1b4;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar4 & VK_SHADER_STAGE_FRAGMENT_BIT) != 0) {
    VVar2 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (VVar2 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_00);
    }
    else {
      local_200._0_8_ = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    if (VVar2 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if (VVar2 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      local_240 = local_230;
      pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_240);
    }
    else {
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    if (VVar2 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      local_1d8 = local_1c8;
      pcVar3 = (this->m_caseDef).mainCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (this->m_caseDef).mainCode._M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
    }
    else {
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"frag","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_4_ = 1;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    VVar4 = local_1b4;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar4 & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0) {
    VVar2 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(vertices = 3) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," gl_in[gl_MaxPatchVertices];\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," gl_out[];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_01);
    }
    else {
      local_200._0_8_ = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      local_240 = local_230;
      pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_240);
    }
    else {
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      local_1d8 = local_1c8;
      pcVar3 = (this->m_caseDef).mainCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (this->m_caseDef).mainCode._M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
    }
    else {
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",
               0x4e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    if (gl_InvocationID == 0)\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    {\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_TessLevelInner[0] = 3;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_TessLevelOuter[0] = 2;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_TessLevelOuter[1] = 2;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"        gl_TessLevelOuter[2] = 2;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    }\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"tesc","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_4_ = 3;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    VVar4 = local_1b4;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar4 & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0) {
    VVar2 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles, equal_spacing, ccw) in;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," gl_in[gl_MaxPatchVertices];\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_02);
    }
    else {
      local_200._0_8_ = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      local_240 = local_230;
      pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_240);
    }
    else {
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    if (VVar2 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      local_1d8 = local_1c8;
      pcVar3 = (this->m_caseDef).mainCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (this->m_caseDef).mainCode._M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
    }
    else {
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    gl_Position = vec4(p0 + p1 + p2, 1.0);\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"tese","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_4_ = 4;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    VVar4 = local_1b4;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar4 & VK_SHADER_STAGE_GEOMETRY_BIT) != 0) {
    VVar2 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangles) in;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(triangle_strip, max_vertices = 3) out;\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," gl_in[];\n",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (VVar2 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_03);
    }
    else {
      local_200._0_8_ = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    if (VVar2 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if (VVar2 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      local_240 = local_230;
      pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length)
      ;
      std::__cxx11::string::append((char *)&local_240);
    }
    else {
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    if (VVar2 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      local_1d8 = local_1c8;
      pcVar3 = (this->m_caseDef).mainCode._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (this->m_caseDef).mainCode._M_string_length);
      std::__cxx11::string::append((char *)&local_1d8);
    }
    else {
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    gl_Position = gl_in[0].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    gl_Position = gl_in[1].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    gl_Position = gl_in[2].gl_Position;\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    EndPrimitive();\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"geom","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_4_ = 2;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    VVar4 = local_1b4;
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((VVar4 & VK_SHADER_STAGE_COMPUTE_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)auStack_248 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0xa0);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
              ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
               specConstants_04);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
    generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_220._M_dataplus._M_p,local_220._M_string_length);
    pcVar3 = (this->m_caseDef).globalCode._M_dataplus._M_p;
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar3,pcVar3 + (this->m_caseDef).globalCode._M_string_length);
    std::__cxx11::string::append((char *)&local_240);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(this->m_caseDef).mainCode._M_dataplus._M_p,
                        (this->m_caseDef).mainCode._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    paVar1 = &local_220.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"comp","");
    pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_1b0->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    local_200._0_4_ = 5;
    local_200._8_8_ = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_200 + 8),local_240,(long)local_240 + local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar9->sources + (local_200._0_8_ & 0xffffffff),(value_type *)(local_200 + 8));
    if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
      operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void SpecConstantTest::initPrograms (SourceCollections& programCollection) const
{
	// Always add vertex and fragment to graphics stages
	VkShaderStageFlags requiredStages = m_stage;

	if (requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS)
		requiredStages |= VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

	if (requiredStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		requiredStages |= VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;

	// Either graphics or compute must be defined, but not both
	DE_ASSERT(((requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS) != 0) != ((requiredStages & VK_SHADER_STAGE_COMPUTE_BIT) != 0));

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_VERTEX_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) in highp vec4 position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_FRAGMENT_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) out highp vec4 fragColor;\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    if (gl_InvocationID == 0)\n"
			<< "    {\n"
			<< "        gl_TessLevelInner[0] = 3;\n"
			<< "        gl_TessLevelOuter[0] = 2;\n"
			<< "        gl_TessLevelOuter[1] = 2;\n"
			<< "        gl_TessLevelOuter[2] = 2;\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(p0 + p1 + p2, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    EndPrimitive();\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			// Don't define work group size, use the default or specialization constants
			<< "\n"
			<< generateSpecConstantCode(m_caseDef.specConstants)
			<< generateSSBOCode(m_caseDef.ssboCode)
			<< m_caseDef.globalCode + "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< m_caseDef.mainCode
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}